

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O3

int CompareFontTables(TestCase *ptcase,GrcRtFileFont *pfontBmark,GrcRtFileFont *pfontTest)

{
  bool bVar1;
  fontTableId32 fVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_EAX;
  void *pvVar5;
  undefined7 extraout_var;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbBuffer;
  byte *pbBuffer_00;
  void *unaff_RBP;
  _Alloc_hider _Var8;
  void *unaff_R12;
  undefined1 auVar9 [16];
  int ec;
  int chwMaxGlyphID;
  size_t cbGlatSzT;
  size_t cbGlatSzB;
  GrBufferIStream grstrmT;
  GrBufferIStream grstrmB;
  size_t cbSillSzT;
  size_t cbFeatSzT;
  size_t cbSilfSzT;
  size_t cbSillSzB;
  size_t cbFeatSzB;
  size_t cbSilfSzB;
  size_t cbNameSzT;
  size_t cbGlocSzT;
  size_t cbCmapSzT;
  size_t cbHeadSzT;
  size_t cbNameSzB;
  size_t cbGlocSzB;
  size_t cbCmapSzB;
  size_t cbHeadSzB;
  GrBufferIStream grstrmGlatB;
  GrBufferIStream grstrmGlatT;
  GrBufferIStream grstrmGlocB;
  GrBufferIStream grstrmGlocT;
  int local_704;
  byte *local_700;
  byte *local_6f8;
  GrcRtFileFont *local_6f0;
  byte *local_6e8;
  byte *local_6e0;
  int local_6d4;
  byte *local_6d0;
  byte *local_6c8;
  byte *local_6c0;
  int local_6b8;
  undefined4 uStack_6b4;
  int local_6b0;
  undefined4 uStack_6ac;
  byte *local_6a8;
  GrBufferIStream local_6a0;
  GrBufferIStream local_680;
  int local_660;
  undefined4 uStack_65c;
  int local_658;
  undefined4 uStack_654;
  int local_650;
  undefined4 uStack_64c;
  int local_648;
  undefined4 uStack_644;
  int local_640;
  undefined4 uStack_63c;
  int local_638;
  undefined4 uStack_634;
  void *local_630;
  void *local_628;
  void *local_620;
  void *local_618;
  size_t local_610;
  int local_608 [2];
  size_t local_600;
  size_t local_5f8;
  size_t local_5f0;
  int local_5e8 [2];
  size_t local_5e0;
  size_t local_5d8;
  GrBufferIStream local_5d0;
  string local_5b0 [3];
  string local_550 [3];
  string local_4f0;
  string local_4d0;
  string local_4b0 [3];
  string local_450;
  string local_430;
  string local_410 [3];
  string local_3b0;
  string local_390;
  string local_370 [3];
  string local_310;
  string local_2f0;
  string local_2d0 [3];
  string local_270;
  string local_250;
  string local_230 [3];
  string local_1d0;
  string local_1b0;
  string local_190 [3];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  GrBufferIStream local_90;
  GrBufferIStream local_70;
  GrBufferIStream local_50;
  
  local_704 = 0;
  local_6f0 = pfontTest;
  fVar2 = TtfUtil::TableIdTag(ktiHead);
  pvVar5 = GrcRtFileFont::getTable(pfontBmark,fVar2,&local_5d8);
  if (pvVar5 == (void *)0x0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"ERROR: benchmark font has empty head table","");
    OutputError(&local_704,ptcase,&local_b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    pvVar5 = (void *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiHead);
    unaff_R12 = GrcRtFileFont::getTable(local_6f0,fVar2,&local_5f8);
    if (unaff_R12 == (void *)0x0) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"ERROR: test font has empty head table","");
      OutputError(&local_704,ptcase,&local_d0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      unaff_R12 = (void *)0x0;
    }
    else {
      if (local_5d8 != local_5f8) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"ERROR: size of head tables do not match","");
        OutputError(&local_704,ptcase,&local_f0,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
      }
      iVar3 = TtfUtil::DesignUnits(pvVar5);
      iVar4 = TtfUtil::DesignUnits(unaff_R12);
      if (iVar3 != iVar4) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"ERROR: design units do not match","");
        OutputError(&local_704,ptcase,&local_110,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      bVar1 = TtfUtil::IsItalic(pvVar5);
      unaff_RBP = (void *)(CONCAT71(extraout_var,bVar1) & 0xffffffff);
      bVar1 = TtfUtil::IsItalic(unaff_R12);
      if (SUB81(unaff_RBP,0) != bVar1) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"ERROR: italic flags do not match","");
        OutputError(&local_704,ptcase,&local_130,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  local_620 = unaff_R12;
  local_618 = pvVar5;
  fVar2 = TtfUtil::TableIdTag(ktiCmap);
  pvVar5 = GrcRtFileFont::getTable(pfontBmark,fVar2,&local_5e0);
  if (pvVar5 == (void *)0x0) {
    local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"ERROR: benchmark font has empty cmap table","");
    OutputError(&local_704,ptcase,local_190,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190[0]._M_dataplus._M_p != &local_190[0].field_2) {
      operator_delete(local_190[0]._M_dataplus._M_p,local_190[0].field_2._M_allocated_capacity + 1);
    }
    pvVar5 = (void *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiCmap);
    unaff_RBP = GrcRtFileFont::getTable(local_6f0,fVar2,&local_600);
    if (unaff_R12 == (void *)0x0) {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"ERROR: test font has empty cmap table","");
      OutputError(&local_704,ptcase,&local_1b0,-1);
      _Var8._M_p = local_1b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
LAB_001028e6:
        operator_delete(_Var8._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
    }
    else if (local_5e0 != local_600) {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,"ERROR: size of cmap tables do not match","");
      OutputError(&local_704,ptcase,&local_1d0,-1);
      local_1b0.field_2._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
      _Var8._M_p = local_1d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) goto LAB_001028e6;
    }
  }
  local_630 = unaff_RBP;
  local_628 = pvVar5;
  fVar2 = TtfUtil::TableIdTag(ktiName);
  local_6e0 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar2,&local_5f0);
  if (local_6e0 == (byte *)0x0) {
    local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"ERROR: benchmark font has empty name table","");
    OutputError(&local_704,ptcase,local_230,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
      operator_delete(local_230[0]._M_dataplus._M_p,local_230[0].field_2._M_allocated_capacity + 1);
    }
    local_6e0 = (byte *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiName);
    local_6e8 = (byte *)GrcRtFileFont::getTable(local_6f0,fVar2,&local_610);
    if (local_6e8 == (byte *)0x0) {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,"ERROR: test font has empty name table","");
      OutputError(&local_704,ptcase,&local_250,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_6e8 = (byte *)0x0;
    }
    else if (local_5f0 != local_610) {
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"ERROR: size of name tables do not match","");
      OutputError(&local_704,ptcase,&local_270,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
    }
  }
  fVar2 = TtfUtil::TableIdTag(ktiSilf);
  pbVar6 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar2,(size_t *)&local_638);
  if (pbVar6 == (byte *)0x0) {
    local_2d0[0]._M_dataplus._M_p = (pointer)&local_2d0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2d0,"ERROR: benchmark font has empty Silf table","");
    OutputError(&local_704,ptcase,local_2d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0[0]._M_dataplus._M_p != &local_2d0[0].field_2) {
      operator_delete(local_2d0[0]._M_dataplus._M_p,local_2d0[0].field_2._M_allocated_capacity + 1);
    }
    pbVar6 = (byte *)0x0;
LAB_00102c31:
    pbVar7 = (byte *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiSilf);
    pbVar7 = (byte *)GrcRtFileFont::getTable(local_6f0,fVar2,(size_t *)&local_650);
    if (pbVar7 == (byte *)0x0) {
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"ERROR: test font has empty Silf table","");
      OutputError(&local_704,ptcase,&local_2f0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00102c31;
    }
    if (CONCAT44(uStack_634,local_638) != CONCAT44(uStack_64c,local_650)) {
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_310,"ERROR: size of Silf tables do not match","");
      OutputError(&local_704,ptcase,&local_310,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_6c0 = pbVar7;
  local_6a8 = pbVar6;
  fVar2 = TtfUtil::TableIdTag(ktiFeat);
  pbVar6 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar2,(size_t *)&local_640);
  if (pbVar6 == (byte *)0x0) {
    local_370[0]._M_dataplus._M_p = (pointer)&local_370[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_370,"ERROR: benchmark font has empty Feat table","");
    OutputError(&local_704,ptcase,local_370,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370[0]._M_dataplus._M_p != &local_370[0].field_2) {
      operator_delete(local_370[0]._M_dataplus._M_p,local_370[0].field_2._M_allocated_capacity + 1);
    }
    pbVar6 = (byte *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiFeat);
    pbVar7 = (byte *)GrcRtFileFont::getTable(local_6f0,fVar2,(size_t *)&local_658);
    if (pbVar7 == (byte *)0x0) {
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_390,"ERROR: test font has empty Feat table","");
      OutputError(&local_704,ptcase,&local_390,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      pbVar7 = (byte *)0x0;
    }
    else if (CONCAT44(uStack_63c,local_640) != CONCAT44(uStack_654,local_658)) {
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b0,"ERROR: size of Feat tables do not match","");
      OutputError(&local_704,ptcase,&local_3b0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_6d0 = pbVar7;
  local_6c8 = pbVar6;
  fVar2 = TtfUtil::TableIdTag(ktiGlat);
  local_6f8 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar2,(size_t *)&local_6b0);
  if (local_6f8 == (byte *)0x0) {
    local_410[0]._M_dataplus._M_p = (pointer)&local_410[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_410,"ERROR: benchmark font has empty Glat table","");
    OutputError(&local_704,ptcase,local_410,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410[0]._M_dataplus._M_p != &local_410[0].field_2) {
      operator_delete(local_410[0]._M_dataplus._M_p,local_410[0].field_2._M_allocated_capacity + 1);
    }
    local_6f8 = (byte *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiGlat);
    local_700 = (byte *)GrcRtFileFont::getTable(local_6f0,fVar2,(size_t *)&local_6b8);
    if (local_700 == (byte *)0x0) {
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_430,"ERROR: test font has empty Glat table","");
      OutputError(&local_704,ptcase,&local_430,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      local_700 = (byte *)0x0;
    }
    else if (CONCAT44(uStack_6ac,local_6b0) != CONCAT44(uStack_6b4,local_6b8)) {
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_450,"ERROR: size of Glat tables do not match","");
      OutputError(&local_704,ptcase,&local_450,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
    }
  }
  fVar2 = TtfUtil::TableIdTag(ktiGloc);
  pbVar6 = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar2,(size_t *)local_5e8);
  if (pbVar6 == (byte *)0x0) {
    local_4b0[0]._M_dataplus._M_p = (pointer)&local_4b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b0,"ERROR: benchmark font has empty Gloc table","");
    OutputError(&local_704,ptcase,local_4b0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0[0]._M_dataplus._M_p != &local_4b0[0].field_2) {
      operator_delete(local_4b0[0]._M_dataplus._M_p,local_4b0[0].field_2._M_allocated_capacity + 1);
    }
    pbVar6 = (byte *)0x0;
  }
  else {
    fVar2 = TtfUtil::TableIdTag(ktiGloc);
    pbVar7 = (byte *)GrcRtFileFont::getTable(local_6f0,fVar2,(size_t *)local_608);
    if (pbVar7 != (byte *)0x0) {
      if (CONCAT44(uStack_6ac,local_6b0) != CONCAT44(uStack_6b4,local_6b8)) {
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4f0,"ERROR: size of Gloc tables do not match","");
        OutputError(&local_704,ptcase,&local_4f0,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0010310b;
    }
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4d0,"ERROR: test font has empty Gloc table","");
    OutputError(&local_704,ptcase,&local_4d0,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar7 = (byte *)0x0;
LAB_0010310b:
  fVar2 = TtfUtil::TableIdTag(ktiSill);
  pbBuffer = (byte *)GrcRtFileFont::getTable(pfontBmark,fVar2,(size_t *)&local_648);
  fVar2 = TtfUtil::TableIdTag(ktiSill);
  pbBuffer_00 = (byte *)GrcRtFileFont::getTable(local_6f0,fVar2,(size_t *)&local_660);
  if (CONCAT44(uStack_644,local_648) != CONCAT44(uStack_65c,local_660)) {
    local_550[0]._M_dataplus._M_p = (pointer)&local_550[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_550,"ERROR: size of Sill tables do not match","");
    OutputError(&local_704,ptcase,local_550,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550[0]._M_dataplus._M_p != &local_550[0].field_2) {
      operator_delete(local_550[0]._M_dataplus._M_p,local_550[0].field_2._M_allocated_capacity + 1);
    }
  }
  if (local_6c0 != (byte *)0x0) {
    gr::GrBufferIStream::GrBufferIStream(&local_680);
    gr::GrBufferIStream::GrBufferIStream(&local_6a0);
    gr::GrBufferIStream::OpenBuffer(&local_680,local_6a8,local_638);
    gr::GrBufferIStream::OpenBuffer(&local_6a0,local_6c0,local_650);
    CompareSilfTables(&local_704,ptcase,&local_680.super_GrIStream,&local_6a0.super_GrIStream,
                      &local_6d4);
    gr::GrBufferIStream::Close(&local_680);
    gr::GrBufferIStream::Close(&local_6a0);
    if (local_6d4 == -1) {
      local_5b0[0]._M_dataplus._M_p = (pointer)&local_5b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b0,
                 "[Skipping Gloc and Glat tables since max glyph IDs do not match]","");
      OutputError((int *)&local_5d0,ptcase,local_5b0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0[0]._M_dataplus._M_p != &local_5b0[0].field_2) {
        operator_delete(local_5b0[0]._M_dataplus._M_p,local_5b0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    else {
      auVar9._0_4_ = -(uint)((int)((ulong)local_6f8 >> 0x20) == 0 && (int)local_6f8 == 0);
      auVar9._4_4_ = -(uint)((int)pbVar6 == 0 && (int)((ulong)pbVar6 >> 0x20) == 0);
      auVar9._8_4_ = -(uint)((int)((ulong)local_700 >> 0x20) == 0 && (int)local_700 == 0);
      auVar9._12_4_ = -(uint)((int)pbVar7 == 0 && (int)((ulong)pbVar7 >> 0x20) == 0);
      iVar3 = movmskps(extraout_EAX,auVar9);
      if (iVar3 == 0) {
        gr::GrBufferIStream::GrBufferIStream(&local_5d0);
        gr::GrBufferIStream::GrBufferIStream(&local_70);
        gr::GrBufferIStream::GrBufferIStream(&local_90);
        gr::GrBufferIStream::GrBufferIStream(&local_50);
        gr::GrBufferIStream::OpenBuffer(&local_5d0,local_6f8,local_6b0);
        gr::GrBufferIStream::OpenBuffer(&local_70,pbVar6,local_5e8[0]);
        gr::GrBufferIStream::OpenBuffer(&local_90,local_700,local_6b8);
        gr::GrBufferIStream::OpenBuffer(&local_50,pbVar7,local_608[0]);
        CompareGlatAndGlocTables
                  (&local_704,ptcase,local_6d4,&local_5d0.super_GrIStream,&local_70.super_GrIStream,
                   &local_90.super_GrIStream,&local_50.super_GrIStream);
        gr::GrBufferIStream::Close(&local_5d0);
        gr::GrBufferIStream::Close(&local_70);
        gr::GrBufferIStream::Close(&local_90);
        gr::GrBufferIStream::Close(&local_50);
        gr::GrBufferIStream::~GrBufferIStream(&local_50);
        gr::GrBufferIStream::~GrBufferIStream(&local_90);
        gr::GrBufferIStream::~GrBufferIStream(&local_70);
        gr::GrBufferIStream::~GrBufferIStream(&local_5d0);
      }
    }
    if (local_6d0 != (byte *)0x0 && local_6c8 != (byte *)0x0) {
      gr::GrBufferIStream::OpenBuffer(&local_680,local_6c8,local_640);
      gr::GrBufferIStream::OpenBuffer(&local_6a0,local_6d0,local_658);
      CompareFeatTables(&local_704,ptcase,&local_680.super_GrIStream,&local_6a0.super_GrIStream,
                        local_6e0,local_6e8);
      gr::GrBufferIStream::Close(&local_680);
      gr::GrBufferIStream::Close(&local_6a0);
    }
    if (pbBuffer_00 != (byte *)0x0 && pbBuffer != (byte *)0x0) {
      gr::GrBufferIStream::OpenBuffer(&local_680,pbBuffer,local_648);
      gr::GrBufferIStream::OpenBuffer(&local_6a0,pbBuffer_00,local_660);
      CompareSillTables(&local_704,ptcase,&local_680.super_GrIStream,&local_6a0.super_GrIStream);
      gr::GrBufferIStream::Close(&local_680);
      gr::GrBufferIStream::Close(&local_6a0);
    }
    if (local_618 != (void *)0x0) {
      operator_delete__(local_618);
    }
    if (local_620 != (void *)0x0) {
      operator_delete__(local_620);
    }
    if (local_628 != (void *)0x0) {
      operator_delete__(local_628);
    }
    if (local_630 != (void *)0x0) {
      operator_delete__(local_630);
    }
    if (local_6e0 != (byte *)0x0) {
      operator_delete__(local_6e0);
    }
    if (local_6e8 != (byte *)0x0) {
      operator_delete__(local_6e8);
    }
    if (local_6a8 != (byte *)0x0) {
      operator_delete__(local_6a8);
    }
    operator_delete__(local_6c0);
    if (local_6c8 != (byte *)0x0) {
      operator_delete__(local_6c8);
    }
    if (local_6d0 != (byte *)0x0) {
      operator_delete__(local_6d0);
    }
    if (local_6f8 != (byte *)0x0) {
      operator_delete__(local_6f8);
    }
    if (local_700 != (byte *)0x0) {
      operator_delete__(local_700);
    }
    if (pbVar6 != (byte *)0x0) {
      operator_delete__(pbVar6);
    }
    if (pbVar7 != (byte *)0x0) {
      operator_delete__(pbVar7);
    }
    if (pbBuffer != (byte *)0x0) {
      operator_delete__(pbBuffer);
    }
    if (pbBuffer_00 != (byte *)0x0) {
      operator_delete__(pbBuffer_00);
    }
    iVar3 = local_704;
    gr::GrBufferIStream::~GrBufferIStream(&local_6a0);
    gr::GrBufferIStream::~GrBufferIStream(&local_680);
    local_704 = iVar3;
  }
  return local_704;
}

Assistant:

int CompareFontTables(TestCase * ptcase, GrcRtFileFont * pfontBmark, GrcRtFileFont * pfontTest)
{
	int ec = 0; // error count

	// benchmark font buffers
	const gr::byte * pHeadTblB; const gr::byte * pCmapTblB; const gr::byte * pSileTblB; const gr::byte * pSilfTblB;
	const gr::byte * pFeatTblB; const gr::byte * pGlatTblB; const gr::byte * pGlocTblB; const gr::byte * pNameTblB; const gr::byte * pSillTblB;
	size_t cbHeadSzB, cbCmapSzB, /*cbSileSzB,*/ cbSilfSzB, cbFeatSzB, cbGlatSzB, cbGlocSzB, cbNameSzB, cbSillSzB;
	// test font buffers
	const gr::byte * pHeadTblT; const gr::byte * pCmapTblT; const gr::byte * pSileTblT; const gr::byte * pSilfTblT;
	const gr::byte * pFeatTblT; const gr::byte * pGlatTblT; const gr::byte * pGlocTblT; const gr::byte * pNameTblT; const gr::byte * pSillTblT;
	size_t cbHeadSzT, cbCmapSzT, /*cbSileSzT,*/ cbSilfSzT, cbFeatSzT, cbGlatSzT, cbGlocSzT, cbNameSzT, cbSillSzT;

	// head table
	try {
		pHeadTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiHead), &cbHeadSzB));
		if (pHeadTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty head table");
		else
		{
			try {
				pHeadTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiHead), &cbHeadSzT));
				if (pHeadTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty head table");
				else
				{
					if (cbHeadSzB != cbHeadSzT)
						OutputError(ec, ptcase, "ERROR: size of head tables do not match");
					if (TtfUtil::DesignUnits(pHeadTblB) != TtfUtil::DesignUnits(pHeadTblT))
						OutputError(ec, ptcase, "ERROR: design units do not match");
					if (TtfUtil::IsItalic(pHeadTblB) != TtfUtil::IsItalic(pHeadTblT))
						OutputError(ec, ptcase, "ERROR: italic flags do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR, could not read test font head table");
				pHeadTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font head table");
		pHeadTblB = NULL;
		pHeadTblT = NULL;
	}

	// TODO: handle Sile table.
	pSileTblB = NULL;
	pSileTblT = NULL;

	// cmap

	try {
		pCmapTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiCmap), &cbCmapSzB));
		if (pCmapTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty cmap table");
		else
		{
			try {
				pCmapTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiCmap), &cbCmapSzT));
				if (pHeadTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty cmap table");
				else
				{
					if (cbCmapSzB != cbCmapSzT)
						OutputError(ec, ptcase, "ERROR: size of cmap tables do not match");
					// TBD: do we need to test the contents of the cmap?
					// The Graphite compiler shouldn't be changing it.
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font cmap table");
				pCmapTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font cmap table");
		pCmapTblB = NULL;
		pCmapTblT = NULL;
	}

	// name

	// Currently the only stuff we're getting from the name table are our feature names,
	// so use the version from the Graphite font (not the base font if any).
	//////if (m_fUseSepBase)
	//////	pgg->SetupGraphics(&chrpOriginal);

	// name - need feature names later
	try {
        pNameTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiName), &cbNameSzB));
		if (pNameTblB == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty name table");
		else
		{
			try {
				pNameTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiName), &cbNameSzT));
				if (pNameTblT == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty name table");
				else
				{
					if (cbNameSzB != cbNameSzT)
						OutputError(ec, ptcase, "ERROR: size of name tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font name table");
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font name table");
	}

	/****
	Obtain font name from InitNew() now instead of reading from font file. InitNew should
	should have a correct font name passed to it since it should come from a font registered
	by GrFontInst.exe. This commented code could be use to verify name in font file matches.
	NOTE: if we ever use this code again, make sure we're using the base font name table,
	not the Graphite wrapper font name table.
	// find the font family name
	if (!TtfUtil::Get31EngFamilyInfo(vbName.Begin(), lnNameOff, lnNameSz))
	{	// use Name table which is Symbol encode instead
		// this could cause problems if a real Symbol writing system is used in the name table
		// however normally real Unicode values are used instead a Symbol writing system
		if (!TtfUtil::Get30EngFamilyInfo(vbName.Begin(), lnNameOff, lnNameSz))
		{
			ReturnResult(kresFail);
		}
		// test for Symbol writing system. first byte of Unicode id should be 0xF0
		if (vbName[lnNameOff + 1] == (unsigned char)0xF0) // 1 - Unicode id is big endian
			ReturnResult(kresFail);
	}
	if (!TtfUtil::SwapWString(vbName.Begin() + lnNameOff, lnNameSz / sizeof(utf16)))
		ReturnResult(kresFail);

	m_stuFaceName = std::wstring((utf16 *)(vbName.begin() + lnNameOff), lnNameSz / sizeof(utf16));
	****/

	// Silf
	try {
		pSilfTblT = NULL;
		if ((pSilfTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiSilf), &cbSilfSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Silf table");
		else
		{
			try {
				if ((pSilfTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiSilf), &cbSilfSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Silf table");
				else
				{
					if (cbSilfSzB != cbSilfSzT)
						OutputError(ec, ptcase, "ERROR: size of Silf tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Silf table");
				pSilfTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Silf table");
		pSilfTblB = NULL;
		pSilfTblT = NULL;
	}

	// Feat
	try {
		if ((pFeatTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiFeat), &cbFeatSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Feat table");
		else
		{
			try {
				if ((pFeatTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiFeat), &cbFeatSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Feat table");
				else
				{
					if (cbFeatSzB != cbFeatSzT)
						OutputError(ec, ptcase, "ERROR: size of Feat tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Feat table");
				pFeatTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Feat table");
		pFeatTblB = NULL;
		pFeatTblT = NULL;
	}


	// Glat
	try {
		if ((pGlatTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiGlat), &cbGlatSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Glat table");
		else
		{
			try {
				if ((pGlatTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiGlat), &cbGlatSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Glat table");
				else
				{
					if (cbGlatSzB != cbGlatSzT)
						OutputError(ec, ptcase, "ERROR: size of Glat tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Glat table");
				pGlocTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Glat table");
		pGlocTblB = NULL;
		pGlocTblT = NULL;
	}

	// Gloc
	try {
		if ((pGlocTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiGloc), &cbGlocSzB))) == NULL)
			OutputError(ec, ptcase, "ERROR: benchmark font has empty Gloc table");
		else
		{
			try {
				if ((pGlocTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiGloc), &cbGlocSzT))) == NULL)
					OutputError(ec, ptcase, "ERROR: test font has empty Gloc table");
				else
				{
					if (cbGlatSzB != cbGlatSzT)
						OutputError(ec, ptcase, "ERROR: size of Gloc tables do not match");
				}
			}
			catch (...)
			{
				OutputError(ec, ptcase, "ERROR: could not read test font Gloc table");
				pGlatTblT = NULL;
			}
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: could not read benchmark font Gloc table");
		pGlatTblB = NULL;
		pGlatTblT = NULL;
	}

	// Sill
	try {
		pSillTblB = static_cast<const gr::byte *> (pfontBmark->getTable(TtfUtil::TableIdTag(ktiSill), &cbSillSzB));
		try {
			pSillTblT = static_cast<const gr::byte *> (pfontTest->getTable(TtfUtil::TableIdTag(ktiSill), &cbSillSzT));
			if (cbSillSzB != cbSillSzT)
				OutputError(ec, ptcase, "ERROR: size of Sill tables do not match");
		}
		catch (...)
		{
			OutputError(ec, ptcase, "ERROR: in attempting to read test font Sill table");
			pSillTblT = NULL;
		}
	}
	catch (...)
	{
		OutputError(ec, ptcase, "ERROR: in attempting to read benchmark font Sill table");
		pSillTblB = NULL;
		pSillTblT = NULL;
	}

	if (pSilfTblT == NULL)
		return ec;
	Assert(pSilfTblB);

	GrBufferIStream grstrmB, grstrmT;
	grstrmB.OpenBuffer((gr::byte *)pSilfTblB, cbSilfSzB);
	grstrmT.OpenBuffer((gr::byte *)pSilfTblT, cbSilfSzT);
	int chwMaxGlyphID;
	CompareSilfTables(ec, ptcase, grstrmB, grstrmT, &chwMaxGlyphID);
	grstrmB.Close();
	grstrmT.Close();

	if (chwMaxGlyphID == -1)
	{
		int ecBogus;
		OutputError(ecBogus, ptcase, "[Skipping Gloc and Glat tables since max glyph IDs do not match]");
	}
	else if (pGlatTblB && pGlocTblB && pGlatTblT && pGlocTblT)
	{
		GrBufferIStream grstrmGlatB, grstrmGlocB, grstrmGlatT, grstrmGlocT;
		grstrmGlatB.OpenBuffer((gr::byte *)pGlatTblB, cbGlatSzB);
		grstrmGlocB.OpenBuffer((gr::byte *)pGlocTblB, cbGlocSzB);
		grstrmGlatT.OpenBuffer((gr::byte *)pGlatTblT, cbGlatSzT);
		grstrmGlocT.OpenBuffer((gr::byte *)pGlocTblT, cbGlocSzT);
		CompareGlatAndGlocTables(ec, ptcase, chwMaxGlyphID, grstrmGlatB, grstrmGlocB, grstrmGlatT, grstrmGlocT);
		grstrmGlatB.Close();
		grstrmGlocB.Close();
		grstrmGlatT.Close();
		grstrmGlocT.Close();
	}

	if (pFeatTblB && pFeatTblT)
	{
		grstrmB.OpenBuffer((gr::byte *)pFeatTblB, cbFeatSzB);
		grstrmT.OpenBuffer((gr::byte *)pFeatTblT, cbFeatSzT);
		CompareFeatTables(ec, ptcase, grstrmB, grstrmT, (gr::byte*)pNameTblB, (gr::byte*)pNameTblT);
		grstrmB.Close();
		grstrmT.Close();
	}

	if (pSillTblB && pSillTblT)
	{
		grstrmB.OpenBuffer((gr::byte *)pSillTblB, cbSillSzB);
		grstrmT.OpenBuffer((gr::byte *)pSillTblT, cbSillSzT);
		CompareSillTables(ec, ptcase, grstrmB, grstrmT);
		grstrmB.Close();
		grstrmT.Close();
	}

	delete[] pHeadTblB;
	delete[] pHeadTblT;

	delete[] pCmapTblB;
	delete[] pCmapTblT;

	delete[] pNameTblB;
	delete[] pNameTblT;

	delete[] pSilfTblB;
	delete[] pSilfTblT;

	delete[] pFeatTblB;
	delete[] pFeatTblT;

	delete[] pGlatTblB;
	delete[] pGlatTblT;

	delete[] pGlocTblB;
	delete[] pGlocTblT;

	delete[] pSillTblB;
	delete[] pSillTblT;

	return ec;
}